

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O3

bool __thiscall CSHA1::HashFile(CSHA1 *this,char *szFileName)

{
  bool bVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  uchar uData [8000];
  uchar auStack_1f68 [8000];
  
  if (szFileName == (char *)0x0) {
    return false;
  }
  __stream = fopen(szFileName,"rb");
  if (__stream == (FILE *)0x0) {
    bVar1 = false;
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    if (uVar2 != 0) {
      uVar3 = uVar2 / 8000;
      __n = uVar2 % 8000;
      if (7999 < uVar2) {
        do {
          fread(auStack_1f68,1,8000,__stream);
          Update(this,auStack_1f68,8000);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (__n != 0) {
        fread(auStack_1f68,1,__n,__stream);
        Update(this,auStack_1f68,(uint)__n);
      }
    }
    fclose(__stream);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CSHA1::HashFile(char *szFileName)
{
	unsigned long ulFileSize, ulRest, ulBlocks;
	unsigned long i;
	UINT_8 uData[SHA1_MAX_FILE_BUFFER];
	FILE *fIn;

	if(szFileName == NULL) return false;

	fIn = fopen(szFileName, "rb");
	if(fIn == NULL) return false;

	fseek(fIn, 0, SEEK_END);
	ulFileSize = (unsigned long)ftell(fIn);
	fseek(fIn, 0, SEEK_SET);

	if(ulFileSize != 0)
	{
		ulBlocks = ulFileSize / SHA1_MAX_FILE_BUFFER;
		ulRest = ulFileSize % SHA1_MAX_FILE_BUFFER;
	}
	else
	{
		ulBlocks = 0;
		ulRest = 0;
	}

	for(i = 0; i < ulBlocks; i++)
	{
		fread(uData, 1, SHA1_MAX_FILE_BUFFER, fIn);
		Update((UINT_8 *)uData, SHA1_MAX_FILE_BUFFER);
	}

	if(ulRest != 0)
	{
		fread(uData, 1, ulRest, fIn);
		Update((UINT_8 *)uData, ulRest);
	}

	fclose(fIn); fIn = NULL;
	return true;
}